

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

bool __thiscall sjtu::trainType::getrecord(trainType *this,recordType *record,bool flag)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int day_id;
  int i;
  bool end_flag;
  bool found;
  timeType actual_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 local_ac;
  int *in_stack_ffffffffffffff60;
  timeType *in_stack_ffffffffffffff68;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  trainType *in_stack_ffffffffffffff80;
  timeType local_68;
  timeType local_58;
  timeType local_48;
  int local_38;
  int local_34;
  timeType local_2c;
  byte local_19;
  long local_18;
  bool local_1;
  
  local_19 = in_DL & 1;
  if ((*(byte *)(in_RDI + 0xa799) & 1) == 0) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    timeType::timeType(&local_2c,(timeType *)(in_RDI + 0xa788));
    local_2c._0_8_ = *(undefined8 *)(in_RDI + 0xa768);
    bVar1 = false;
    bVar2 = false;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x18); local_34 = local_34 + 1) {
      if (local_34 != 0) {
        timeType::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        local_2c._0_8_ = local_48._0_8_;
        local_2c._8_8_ = local_48._8_8_;
      }
      if (bVar1) {
        if (*(int *)(local_18 + 0x84) <
            *(int *)(in_RDI + (long)local_34 * 0x1a8 + 0x4c + (long)local_38 * 4)) {
          local_ac = *(undefined4 *)(local_18 + 0x84);
        }
        else {
          local_ac = *(undefined4 *)(in_RDI + (long)local_34 * 0x1a8 + 0x4c + (long)local_38 * 4);
        }
        *(undefined4 *)(local_18 + 0x84) = local_ac;
        *(int *)(local_18 + 0x80) =
             *(int *)(in_RDI + (long)local_34 * 0x1a8 + 0x1bc) + *(int *)(local_18 + 0x80);
        *(int *)(local_18 + 0x88) =
             *(int *)(in_RDI + (long)local_34 * 0x1a8 + 0x1c4) + *(int *)(local_18 + 0x88);
        bVar3 = std::operator==((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff38);
        if (bVar3) {
          *(undefined8 *)(local_18 + 0x70) = local_2c._0_8_;
          *(undefined8 *)(local_18 + 0x78) = local_2c._8_8_;
          bVar2 = true;
          break;
        }
        *(int *)(local_18 + 0x88) =
             *(int *)(in_RDI + (long)local_34 * 0x1a8 + 0x1c0) + *(int *)(local_18 + 0x88);
      }
      else {
        bVar3 = std::operator==((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff38);
        if (bVar3) break;
      }
      if (local_34 != 0) {
        timeType::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        local_2c._0_8_ = local_58._0_8_;
        local_2c._8_8_ = local_58._8_8_;
      }
      bVar3 = std::operator==((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff38);
      if (bVar3) {
        *(undefined4 *)(local_18 + 0x80) = 0;
        *(undefined4 *)(local_18 + 0x88) = 0;
        *(undefined4 *)(local_18 + 0x84) = 100000;
        if (((local_19 & 1) == 0) ||
           (bVar3 = timeType::operator<(&local_2c,(timeType *)(local_18 + 0x60)), bVar3)) {
          local_2c._0_8_ = *(undefined8 *)(local_18 + 0x60);
        }
        if (((local_19 & 1) != 0) &&
           (bVar3 = timeType::operator<(&local_2c,(timeType *)(local_18 + 0x60)), bVar3)) {
          timeType::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          local_2c._0_8_ = local_68._0_8_;
          local_2c._8_8_ = local_68._8_8_;
        }
        in_stack_ffffffffffffff44 = timeType::dateminus(&local_2c,(timeType *)(in_RDI + 0xa768));
        std::__cxx11::string::string(local_90,(string *)(local_18 + 0x20));
        iVar4 = get_Delta_date(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_38 = in_stack_ffffffffffffff44 + iVar4;
        std::__cxx11::string::~string(local_90);
        if ((local_38 < 0) ||
           (in_stack_ffffffffffffff40 = local_38,
           iVar4 = timeType::dateminus((timeType *)(in_RDI + 0xa778),(timeType *)(in_RDI + 0xa768)),
           iVar4 < in_stack_ffffffffffffff40)) break;
        *(undefined8 *)(local_18 + 0x60) = local_2c._0_8_;
        *(undefined8 *)(local_18 + 0x68) = local_2c._8_8_;
        bVar1 = true;
      }
    }
    if ((bVar1) && (bVar2)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool getrecord(recordType *record , bool flag = false)
		{
			if (!is_released) return false;
			timeType actual_time(startTime);
			actual_time.month = saleDate[0].month , actual_time.day = saleDate[0].day;
			bool found = false , end_flag = false;
			for (int i = 0 , day_id;i < stationNum;++ i)
			{
				if (i) actual_time = actual_time + stations[i].travelTime;
				if (found)
				{
					record -> seat = record -> seat < stations[i].seatNum[day_id] ? record -> seat : stations[i].seatNum[day_id];
					record -> price += stations[i].price , record -> duration += stations[i].travelTime;
					if (stations[i].stationName == record -> station[1])
					{
						record -> time[1] = actual_time , end_flag = true;
						break;
					}
					record -> duration += stations[i].stopoverTime;
				}
				else if (stations[i].stationName == record -> station[1]) break;
				if (i) actual_time = actual_time + stations[i].stopoverTime;
				if (stations[i].stationName == record -> station[0])
				{
					record -> price = 0 , record -> duration = 0 , record -> seat = 100000;
					if (!flag || actual_time < record -> time[0]) actual_time.month = record -> time[0].month , actual_time.day = record -> time[0].day;
					if (flag && actual_time < record -> time[0]) actual_time = actual_time + 24 * 60;
					day_id = timeType::dateminus(actual_time , saleDate[0]) + get_Delta_date(record -> station[0]);
					if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) break;
					record -> time[0] = actual_time;
					found = true;
				}
			}
			if (!found || !end_flag) return false;
			return true;
		}